

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::productQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,
          vector<double,_std::allocator<double>_> *row,HighsInt debug_report)

{
  pointer pdVar1;
  pointer piVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> value;
  allocator_type local_61;
  _Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_> local_60;
  value_type local_48;
  
  local_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (result,(long)this->num_row_,(value_type_conflict1 *)&local_60);
  if (this->format_ == kColwise) {
    local_48.hi = 0.0;
    local_48.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)&local_60,(long)this->num_row_
               ,&local_48,&local_61);
    lVar6 = 0;
    while (lVar7 = lVar6, lVar7 < this->num_col_) {
      piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar4 = (long)piVar2[lVar7]; lVar6 = lVar7 + 1, lVar4 < piVar2[lVar7 + 1];
          lVar4 = lVar4 + 1) {
        HighsCDouble::operator+=
                  (local_60._M_impl.super__Vector_impl_data._M_start +
                   (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4],
                   (row->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar7] *
                   (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4]);
        piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    pdVar1 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    uVar3 = (ulong)(uint)this->num_row_;
    if (this->num_row_ < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 * 8 != uVar5; uVar5 = uVar5 + 8) {
      *(double *)((long)pdVar1 + uVar5) =
           *(double *)((long)&(local_60._M_impl.super__Vector_impl_data._M_start)->hi + uVar5 * 2) +
           *(double *)((long)&(local_60._M_impl.super__Vector_impl_data._M_start)->lo + uVar5 * 2);
    }
    std::_Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>::~_Vector_base(&local_60);
  }
  else {
    piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    uVar3 = (ulong)(uint)this->num_row_;
    if (this->num_row_ < 1) {
      uVar3 = uVar5;
    }
    while (uVar5 != uVar3) {
      dVar8 = 0.0;
      dVar9 = 0.0;
      for (lVar6 = (long)piVar2[uVar5]; lVar6 < piVar2[uVar5 + 1]; lVar6 = lVar6 + 1) {
        dVar10 = (row->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start
                 [(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6]] *
                 (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
        dVar11 = dVar9 + dVar10;
        dVar8 = dVar8 + (dVar9 - (dVar11 - dVar10)) + (dVar10 - (dVar11 - (dVar11 - dVar10)));
        dVar9 = dVar11;
      }
      pdVar1[uVar5] = dVar8 + dVar9;
      uVar5 = uVar5 + 1;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::productQuad(vector<double>& result,
                                    const vector<double>& row,
                                    const HighsInt debug_report) const {
  assert(this->formatOk());
  assert((int)row.size() >= this->num_col_);
  result.assign(this->num_row_, 0.0);
  if (this->isColwise()) {
    std::vector<HighsCDouble> value(this->num_row_, 0);
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value[this->index_[iEl]] += row[iCol] * this->value_[iEl];
    }
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++)
      result[iRow] = double(value[iRow]);
  } else {
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        value += row[this->index_[iEl]] * this->value_[iEl];
      result[iRow] = double(value);
    }
  }
}